

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O2

uint argo::utf8::from_hex(char c)

{
  int iVar1;
  uint uVar2;
  json_utf8_exception *this;
  int iVar3;
  undefined7 in_register_00000039;
  
  iVar1 = tolower((int)CONCAT71(in_register_00000039,c));
  iVar3 = (int)(char)iVar1;
  uVar2 = iVar3 - 0x30;
  if (9 < uVar2) {
    if (5 < iVar3 - 0x61U) {
      this = (json_utf8_exception *)__cxa_allocate_exception(0xe0);
      json_utf8_exception::json_utf8_exception(this,invalid_hex_char_e,(char)iVar1);
      __cxa_throw(this,&json_utf8_exception::typeinfo,std::exception::~exception);
    }
    uVar2 = iVar3 - 0x57;
  }
  return uVar2;
}

Assistant:

unsigned int utf8::from_hex(char c)
{
    c = tolower(c);

    if (c >= '0' && c <= '9')
    {
        return c - '0';
    }
    else if (c >= 'a' && c <= 'f')
    {
        return c - 'a' + 10;
    }
    else
    {
        throw json_utf8_exception(json_utf8_exception::invalid_hex_char_e, c);
    }
}